

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  size_type __len1;
  char *__s;
  char *pcVar1;
  size_t __len2;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = (this->pathname_)._M_dataplus._M_p;
  __len1 = (this->pathname_)._M_string_length;
  if (pcVar3 != (char *)0x0) {
    __s = (char *)operator_new__(__len1 + 1);
    memset(__s,0,__len1 + 1);
    cVar2 = *pcVar3;
    pcVar1 = __s;
    while (cVar2 != '\0') {
      *pcVar1 = cVar2;
      if (*pcVar3 == '/') {
        do {
          cVar2 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
        } while (cVar2 == '/');
      }
      else {
        cVar2 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      }
      pcVar1 = pcVar1 + 1;
    }
    *pcVar1 = '\0';
    __len2 = strlen(__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->pathname_,0,__len1,__s,__len2);
    operator_delete__(__s);
    return;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->pathname_,0,__len1,"",0);
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}